

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O1

reference __thiscall
jsoncons::jsonpath::detail::
root_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
::evaluate(root_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference param_4,
          result_options options,error_code *ec)

{
  supertype *psVar1;
  bool bVar2;
  int iVar3;
  mapped_type *ppbVar4;
  undefined4 extraout_var;
  size_t local_40;
  mapped_type local_38;
  
  bVar2 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
          ::is_cached(context,this->id_);
  if (bVar2) {
    local_40 = this->id_;
    ppbVar4 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_unsigned_long,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_unsigned_long,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&context->cache_,&local_40);
    root = *ppbVar4;
  }
  else {
    psVar1 = (this->
             super_base_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
             ).tail_;
    if (psVar1 != (supertype *)0x0) {
      iVar3 = (*psVar1->_vptr_jsonpath_selector[3])(psVar1,context,root,last,root,options,ec);
      root = (reference)CONCAT44(extraout_var,iVar3);
    }
    if (ec->_M_value == 0) {
      local_40 = this->id_;
      local_38 = root;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*>,std::allocator<std::pair<unsigned_long_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<unsigned_long&,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*>,std::allocator<std::pair<unsigned_long_const,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&context->cache_);
    }
  }
  return root;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference, 
                           result_options options,
                           std::error_code& ec) const override
        {
            if (context.is_cached(id_))
            {
                return context.get_from_cache(id_);
            }
            auto& ref = this->evaluate_tail(context, root, last, root, options, ec);
            if (!ec)
            {
                context.add_to_cache(id_, ref);
            }

            return ref;
        }